

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O3

bool __thiscall
ON_Sphere::ClosestPointTo(ON_Sphere *this,ON_3dPoint point,double *longitude,double *latitude)

{
  double dVar1;
  double __y;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_3dVector v;
  ON_3dVector local_40;
  
  ON_3dPoint::operator-(&local_40,&point,(ON_3dPoint *)this);
  dVar1 = ON_3dVector::operator*(&local_40,&(this->plane).zaxis);
  dVar5 = ON_3dVector::operator*(&local_40,&(this->plane).xaxis);
  __y = ON_3dVector::operator*(&local_40,&(this->plane).yaxis);
  if ((((dVar5 != 0.0) || (NAN(dVar5))) || (__y != 0.0)) || (NAN(__y))) {
    dVar3 = ABS(dVar5);
    if (ABS(__y) <= dVar3) {
      dVar4 = (__y / dVar5) * (__y / dVar5);
    }
    else {
      dVar4 = (dVar5 / __y) * (dVar5 / __y);
      dVar3 = ABS(__y);
    }
    if (longitude != (double *)0x0) {
      dVar5 = atan2(__y,dVar5);
      dVar5 = (double)(~-(ulong)(dVar5 < 0.0) & (ulong)dVar5 |
                      (ulong)(dVar5 + 6.283185307179586) & -(ulong)(dVar5 < 0.0));
      *longitude = (double)(-(ulong)(0.0 <= dVar5) &
                           -(ulong)(dVar5 < 6.283185307179586) & (ulong)dVar5);
    }
    bVar2 = true;
    if (latitude != (double *)0x0) {
      dVar1 = atan(dVar1 / (dVar3 * SQRT(dVar4 + 1.0)));
      *latitude = dVar1;
    }
  }
  else {
    if (longitude != (double *)0x0) {
      *longitude = 0.0;
    }
    if (latitude != (double *)0x0) {
      *latitude = *(double *)(&DAT_006cc640 + (ulong)(0.0 <= dVar1) * 8);
    }
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ON_Sphere::ClosestPointTo( 
       ON_3dPoint point, 
       double* longitude,
       double* latitude
       ) const
{
  bool rc = true;
  ON_3dVector v = point - plane.origin;
  double h = v*plane.zaxis;
  double x = v*plane.xaxis;
  double y = v*plane.yaxis;
  double r = 1.0;
  if ( x == 0.0 && y == 0.0 ) {
    if ( longitude )
      *longitude = 0.0;
    if ( latitude )
      *latitude = (h>=0.0) ? 0.5*ON_PI : -0.5*ON_PI;
    if ( h == 0.0 )
      rc = false;
  }
  else {
    if ( fabs(x) >= fabs(y) ) {
      r = y/x;
      r = fabs(x)*sqrt(1.0+r*r);
    }
    else {
      r = x/y;
      r = fabs(y)*sqrt(1.0+r*r);
    }
    if ( longitude ) {
      *longitude = atan2(y,x);
      if ( *longitude < 0.0 )
        *longitude += 2.0*ON_PI;
      if ( *longitude < 0.0 || *longitude >= 2.0*ON_PI)
        *longitude = 0.0;
    }
    if ( latitude )
      *latitude = atan(h/r);
  }
  return rc;
}